

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::VerifyUtf8String
               (char *data,int size,Operation op,char *field_name)

{
  bool bVar1;
  char *pcVar2;
  LogMessage *pLVar3;
  char *value;
  string quoted_field_name;
  LogFinisher local_81;
  string local_80;
  undefined1 local_60 [56];
  
  bVar1 = IsStructurallyValidUTF8(data,size);
  if (!bVar1) {
    pcVar2 = (char *)0x0;
    if (op == SERIALIZE) {
      pcVar2 = "serializing";
    }
    value = "parsing";
    if (op != PARSE) {
      value = pcVar2;
    }
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"");
    if (field_name != (char *)0x0) {
      StringPrintf_abi_cxx11_((string *)local_60," \'%s\'",field_name);
      std::__cxx11::string::operator=((string *)&local_80,(string *)local_60);
      if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
        operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
      }
    }
    LogMessage::LogMessage
              ((LogMessage *)local_60,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format_lite.cc"
               ,0x275);
    pLVar3 = LogMessage::operator<<((LogMessage *)local_60,"String field");
    pLVar3 = LogMessage::operator<<(pLVar3,&local_80);
    pLVar3 = LogMessage::operator<<(pLVar3," contains invalid ");
    pLVar3 = LogMessage::operator<<(pLVar3,"UTF-8 data when ");
    pLVar3 = LogMessage::operator<<(pLVar3,value);
    pLVar3 = LogMessage::operator<<(pLVar3," a protocol ");
    pLVar3 = LogMessage::operator<<
                       (pLVar3,"buffer. Use the \'bytes\' type if you intend to send raw ");
    pLVar3 = LogMessage::operator<<(pLVar3,"bytes. ");
    LogFinisher::operator=(&local_81,pLVar3);
    LogMessage::~LogMessage((LogMessage *)local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar1;
}

Assistant:

bool WireFormatLite::VerifyUtf8String(const char* data,
                                      int size,
                                      Operation op,
                                      const char* field_name) {
  if (!IsStructurallyValidUTF8(data, size)) {
    const char* operation_str = NULL;
    switch (op) {
      case PARSE:
        operation_str = "parsing";
        break;
      case SERIALIZE:
        operation_str = "serializing";
        break;
      // no default case: have the compiler warn if a case is not covered.
    }
    string quoted_field_name = "";
    if (field_name != NULL) {
      quoted_field_name = StringPrintf(" '%s'", field_name);
    }
    // no space below to avoid double space when the field name is missing.
    GOOGLE_LOG(ERROR) << "String field" << quoted_field_name << " contains invalid "
               << "UTF-8 data when " << operation_str << " a protocol "
               << "buffer. Use the 'bytes' type if you intend to send raw "
               << "bytes. ";
    return false;
  }
  return true;
}